

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O2

int fffrwc(fitsfile *fptr,char *expr,char *timeCol,char *parCol,char *valCol,long ntimes,
          double *times,char *time_status,int *status)

{
  size_t __size;
  char cVar1;
  iteratorCol *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined8 *puVar7;
  void *pvVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  long alen;
  iteratorCol *local_208;
  long local_200;
  long local_1f8;
  undefined8 *local_1f0;
  long local_1e8;
  int naxis;
  int typecode;
  long width;
  ParseData lParse;
  parseInfo Info;
  long naxes [5];
  
  iVar3 = *status;
  if (iVar3 == 0) {
    memset(&Info,0,0x90);
    iVar3 = ffiprs(fptr,1,expr,5,&Info.datatype,&local_1e8,&naxis,naxes,&lParse,status);
    if (iVar3 == 0) {
      ffgcno(fptr,0,timeCol,&lParse.timeCol,status);
      ffgcno(fptr,0,parCol,&lParse.parCol,status);
      ffgcno(fptr,0,valCol,&lParse.valCol,status);
      iVar4 = lParse.nCols;
      iVar3 = *status;
      if (iVar3 == 0) {
        lVar6 = local_1e8;
        iVar3 = 0;
        if (local_1e8 < 0) {
          lVar6 = -local_1e8;
          lParse.nCols = 0;
          iVar3 = iVar4;
        }
        if (lVar6 == 1 && Info.datatype == 0xe) {
          local_200 = local_1e8;
          lVar11 = (long)lParse.nCols;
          local_1f8 = ntimes + 1;
          __size = ntimes * 8 + 8;
          iVar4 = lParse.nCols;
          lVar6 = 0;
          if (0 < ntimes) {
            lVar6 = ntimes;
          }
          do {
            piVar2 = lParse.colData;
            iVar4 = iVar4 + -1;
            bVar12 = lVar11 == 0;
            lVar11 = lVar11 + -1;
            if (bVar12) {
              iVar4 = fits_uncompress_hkdata(&lParse,fptr,ntimes,times,status);
              lVar6 = local_200;
              if (iVar4 == 0) {
                if (local_200 < 0) {
                  cVar1 = lParse.Nodes[lParse.resultNode].value.data.log;
                  while (ntimes != 0) {
                    time_status[ntimes + -1] = cVar1;
                    ntimes = ntimes + -1;
                  }
                }
                else {
                  Info.dataPtr = time_status;
                  Info.nullPtr = (void *)0x0;
                  Info.maxRows = ntimes;
                  iVar4 = fits_parser_workfn(ntimes,0,1,ntimes,lParse.nCols,lParse.colData,&Info);
                  *status = iVar4;
                }
              }
              lVar11 = (long)lParse.nCols;
              lVar10 = lVar11 * 0x110 + -0xb0;
              while (bVar12 = lVar11 != 0, lVar11 = lVar11 + -1, bVar12) {
                if (*(int *)((lParse.colData)->colname + lVar10 + -0x18) == 0x10) {
                  if ((void *)**(undefined8 **)((lParse.colData)->colname + lVar10 + -0xc) ==
                      (void *)0x0) {
                    printf("invalid free(((char **)lParse.colData[parNo].array)[0]) at %s:%d\n",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Starlink[P]cfitsio/eval_f.c"
                           ,0x7f7);
                  }
                  else {
                    free((void *)**(undefined8 **)((lParse.colData)->colname + lVar10 + -0xc));
                  }
                }
                if (*(void **)((lParse.colData)->colname + lVar10 + -0xc) == (void *)0x0) {
                  printf("invalid free(lParse.colData[parNo].array) at %s:%d\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Starlink[P]cfitsio/eval_f.c"
                         ,0x7f8);
                }
                else {
                  free(*(void **)((lParse.colData)->colname + lVar10 + -0xc));
                }
                lVar10 = lVar10 + -0x110;
              }
              if (lVar6 < 0) {
                lParse.nCols = iVar3;
              }
              ffcprs(&lParse);
              goto LAB_00145459;
            }
            iVar5 = lParse.colData[lVar11].datatype;
            if (iVar5 == 0x10) {
              iVar5 = ffgtcl(fptr,lParse.valCol,&typecode,&alen,&width,status);
              if (iVar5 != 0) goto LAB_0014530e;
              lVar10 = alen + 1;
              alen = lVar10;
              puVar7 = (undefined8 *)malloc(__size);
              lParse.colData[lVar11].array = puVar7;
              if (puVar7 != (undefined8 *)0x0) {
                local_208 = lParse.colData;
                local_1f0 = puVar7;
                pvVar8 = malloc(lVar10 * local_1f8);
                *local_1f0 = pvVar8;
                if (pvVar8 != (void *)0x0) {
                  for (lVar9 = 0; puVar7 = (undefined8 *)lParse.colData[lVar11].array,
                      lVar6 != lVar9; lVar9 = lVar9 + 1) {
                    puVar7[lVar9 + 1] = puVar7[lVar9] + lVar10;
                  }
                  *(undefined1 *)*puVar7 = 0;
                  goto LAB_0014530e;
                }
                free(local_208[lVar11].array);
              }
LAB_001454bd:
              *status = 0x71;
              break;
            }
            if (iVar5 == 0x52) {
              puVar7 = (undefined8 *)malloc(__size);
              piVar2[lVar11].array = puVar7;
              if (puVar7 == (undefined8 *)0x0) goto LAB_001454bd;
              *puVar7 = 0xb8a83e285ebab4b7;
            }
            else if (iVar5 == 0x29) {
              puVar7 = (undefined8 *)malloc(__size);
              piVar2[lVar11].array = puVar7;
              if (puVar7 == (undefined8 *)0x0) goto LAB_001454bd;
              *puVar7 = 0x4995cdd1;
            }
LAB_0014530e:
          } while (*status == 0);
          lVar6 = (long)(int)lVar11;
          lVar11 = (long)iVar4 * 0x110 + -0xb0;
          while (bVar12 = lVar6 != 0, lVar6 = lVar6 + -1, bVar12) {
            if (*(int *)((lParse.colData)->colname + lVar11 + -0x18) == 0x10) {
              if ((void *)**(undefined8 **)((lParse.colData)->colname + lVar11 + -0xc) ==
                  (void *)0x0) {
                printf("invalid free(((char **)lParse.colData[parNo].array)[0]) at %s:%d\n",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Starlink[P]cfitsio/eval_f.c"
                       ,0x7d7);
              }
              else {
                free((void *)**(undefined8 **)((lParse.colData)->colname + lVar11 + -0xc));
              }
            }
            if (*(void **)((lParse.colData)->colname + lVar11 + -0xc) == (void *)0x0) {
              printf("invalid free(lParse.colData[parNo].array) at %s:%d\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Starlink[P]cfitsio/eval_f.c"
                     ,0x7d8);
            }
            else {
              free(*(void **)((lParse.colData)->colname + lVar11 + -0xc));
            }
            lVar11 = lVar11 + -0x110;
          }
LAB_00145459:
          iVar3 = *status;
        }
        else {
          ffcprs(&lParse);
          ffpmsg("Expression does not evaluate to a logical scalar.");
          *status = 0x1b0;
          iVar3 = 0x1b0;
        }
      }
    }
    else {
      ffcprs(&lParse);
      iVar3 = *status;
    }
  }
  return iVar3;
}

Assistant:

int fffrwc( fitsfile *fptr,        /* I - Input FITS file                    */
            char     *expr,        /* I - Boolean expression                 */
            char     *timeCol,     /* I - Name of time column                */
            char     *parCol,      /* I - Name of parameter column           */
            char     *valCol,      /* I - Name of value column               */
            long     ntimes,       /* I - Number of distinct times in file   */
            double   *times,       /* O - Array of times in file             */
            char     *time_status, /* O - Array of boolean results           */
            int      *status )     /* O - Error status                       */
/*                                                                           */
/* Evaluate a boolean expression for each time in a compressed file,         */
/* returning an array of flags indicating which times evaluated to TRUE/FALSE*/
/*---------------------------------------------------------------------------*/
{
   parseInfo Info;
   long alen, width;
   int parNo, typecode;
   int naxis, constant, nCol=0;
   long nelem, naxes[MAXDIMS], elem;
   char result;
   ParseData lParse;

   if( *status ) return( *status );

   memset(&Info, 0, sizeof(Info));   

   if( ffiprs( fptr, 1, expr, MAXDIMS, &Info.datatype, &nelem,
               &naxis, naxes, &lParse, status ) ) {
      ffcprs(&lParse);
      return( *status );
   }

   fits_get_colnum( fptr, CASEINSEN, timeCol, &lParse.timeCol, status );
   fits_get_colnum( fptr, CASEINSEN, parCol,  &lParse.parCol , status );
   fits_get_colnum( fptr, CASEINSEN, valCol,  &lParse.valCol, status );
   if( *status ) return( *status );
   
   if( nelem<0 ) {
      constant = 1;
      nelem = -nelem;
      nCol = lParse.nCols;
      lParse.nCols = 0;    /*  Ignore all column references  */
   } else
      constant = 0;

   if( Info.datatype!=TLOGICAL || nelem!=1 ) {
      ffcprs(&lParse);
      ffpmsg("Expression does not evaluate to a logical scalar.");
      return( *status = PARSE_BAD_TYPE );
   }

   /*******************************************/
   /* Allocate data arrays for each parameter */
   /*******************************************/
   
   parNo = lParse.nCols;
   while( parNo-- ) {
      switch( lParse.colData[parNo].datatype ) {
      case TLONG:
         if( (lParse.colData[parNo].array =
              (long *)malloc( (ntimes+1)*sizeof(long) )) )
            ((long*)lParse.colData[parNo].array)[0] = 1234554321;
         else
            *status = MEMORY_ALLOCATION;
         break;
      case TDOUBLE:
         if( (lParse.colData[parNo].array =
              (double *)malloc( (ntimes+1)*sizeof(double) )) )
            ((double*)lParse.colData[parNo].array)[0] = DOUBLENULLVALUE;
         else
            *status = MEMORY_ALLOCATION;
         break;
      case TSTRING:
         if( !fits_get_coltype( fptr, lParse.valCol, &typecode,
                                &alen, &width, status ) ) {
            alen++;
            if( (lParse.colData[parNo].array =
                 (char **)malloc( (ntimes+1)*sizeof(char*) )) ) {
               if( (((char **)lParse.colData[parNo].array)[0] =
                    (char *)malloc( (ntimes+1)*sizeof(char)*alen )) ) {
                  for( elem=1; elem<=ntimes; elem++ )
                     ((char **)lParse.colData[parNo].array)[elem] =
                        ((char **)lParse.colData[parNo].array)[elem-1]+alen;
                  ((char **)lParse.colData[parNo].array)[0][0] = '\0';
               } else {
                  free( lParse.colData[parNo].array );
                  *status = MEMORY_ALLOCATION;
               }
            } else {
               *status = MEMORY_ALLOCATION;
            }
         }
         break;
      }
      if( *status ) {
         while( parNo-- ) {
            if( lParse.colData[parNo].datatype==TSTRING )
               FREE( ((char **)lParse.colData[parNo].array)[0] );
            FREE( lParse.colData[parNo].array );
         }
         return( *status );
      }
   }
   
   /**********************************************************************/
   /* Read data from columns needed for the expression and then parse it */
   /**********************************************************************/
   
   if( !fits_uncompress_hkdata( &lParse, fptr, ntimes, times, status ) ) {
      if( constant ) {
         result = lParse.Nodes[lParse.resultNode].value.data.log;
         elem = ntimes;
         while( elem-- ) time_status[elem] = result;
      } else {
         Info.dataPtr  = time_status;
         Info.nullPtr  = NULL;
         Info.maxRows  = ntimes;
         *status       = fits_parser_workfn( ntimes, 0, 1, ntimes, lParse.nCols,
                                     lParse.colData, (void*)&Info );
      }
   }
   
   /************/
   /* Clean up */
   /************/
   
   parNo = lParse.nCols;
   while ( parNo-- ) {
      if( lParse.colData[parNo].datatype==TSTRING )
         FREE( ((char **)lParse.colData[parNo].array)[0] );
      FREE( lParse.colData[parNo].array );
   }
   
   if( constant ) lParse.nCols = nCol;

   ffcprs(&lParse);
   return(*status);
}